

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestDefaultFramebuffer
          (GetAttachmentParametersTest *this)

{
  GLenum GVar1;
  undefined4 uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  size_t sVar8;
  long lVar9;
  GLchar **ppGVar10;
  long lVar11;
  GLint parameter_legacy;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLint parameter_dsa;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  GetAttachmentParametersTest *local_1d8;
  long local_1d0;
  GLenum local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  long lVar7;
  
  local_1d8 = this;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  bVar4 = true;
  lVar11 = 0;
  do {
    local_1e8 = 0;
    local_1dc = 0;
    GVar1 = TestDefaultFramebuffer::attachments[lVar11];
    (**(code **)(lVar7 + 0x830))(0x8d40,GVar1,0x8cd0,&local_1e8);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1085);
    local_1c4 = GVar1;
    (**(code **)(lVar7 + 0x910))(0,GVar1,0x8cd0,&local_1dc);
    iVar5 = (**(code **)(lVar7 + 0x800))();
    if (iVar5 == 0) {
      if (local_1e8 == local_1dc) {
        local_1d0 = lVar11;
        if (local_1dc != 0) {
          ppGVar10 = TestDefaultFramebuffer::optional_pnames_strings;
          lVar9 = 0;
          do {
            GVar1 = local_1c4;
            local_1e0 = 0;
            local_1e4 = 0;
            uVar2 = *(undefined4 *)((long)TestDefaultFramebuffer::optional_pnames + lVar9);
            (**(code **)(lVar7 + 0x830))(0x8d40,local_1c4,uVar2,&local_1e0);
            dVar6 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar6,"glGetFramebufferParameteriv has failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x10be);
            (**(code **)(lVar7 + 0x910))(0,GVar1,uVar2,&local_1e4);
            iVar5 = (**(code **)(lVar7 + 0x800))();
            if (iVar5 != 0) {
              local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log
              ;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
              local_1c0.m_getName = glu::getErrorName;
              local_1c0.m_value = iVar5;
              tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," error when called with ",0x18);
              pcVar3 = *ppGVar10;
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)*(_func_int **)(local_1a8._0_8_ + -0x18) + (int)local_1a8);
              }
              else {
                sVar8 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar3,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," parameter name for ",0x14);
              pcVar3 = TestDefaultFramebuffer::attachments_strings[local_1d0];
              sVar8 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                         ,0x52);
              std::ostream::operator<<((ostringstream *)local_1a8,local_1e8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              bVar4 = false;
            }
            if ((iVar5 == 0) && (local_1e0 != local_1e4)) {
              local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log
              ;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",
                         0x32);
              std::ostream::operator<<((ostringstream *)local_1a8,local_1e4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
              std::ostream::operator<<((ostringstream *)local_1a8,local_1e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," was expected for ",0x12);
              std::ostream::_M_insert<void_const*>((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," parameter name  for ",0x15);
              pcVar3 = TestDefaultFramebuffer::attachments_strings[local_1d0];
              sVar8 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," attachment of default framebuffer.",0x23);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              bVar4 = false;
            }
            lVar9 = lVar9 + 4;
            ppGVar10 = ppGVar10 + 1;
          } while (lVar9 != 0x20);
        }
      }
      else {
        local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
        local_1d0 = lVar11;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetNamedFramebufferAttachmentParameteriv returned ",0x32);
        std::ostream::operator<<((ostringstream *)local_1a8,local_1dc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", but ",6);
        std::ostream::operator<<((ostringstream *)local_1a8,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
                   ,0x5e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        bVar4 = false;
      }
    }
    else {
      local_1b0 = (undefined1  [8])((local_1d8->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ",0x40);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                 ,0x51);
      pcVar3 = TestDefaultFramebuffer::attachments_strings[lVar11];
      sVar8 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," attachment of default framebuffer.",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      bVar4 = false;
      local_1d0 = lVar11;
    }
    lVar11 = local_1d0 + 1;
  } while (lVar11 != 6);
  return bVar4;
}

Assistant:

bool GetAttachmentParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_FRONT_LEFT, GL_FRONT_RIGHT, GL_BACK_LEFT,
											   GL_BACK_RIGHT, GL_DEPTH,		  GL_STENCIL };

	static const glw::GLchar* attachments_strings[] = { "GL_FRONT_LEFT", "GL_FRONT_RIGHT", "GL_BACK_LEFT",
														"GL_BACK_RIGHT", "GL_DEPTH",	   "GL_STENCIL" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy
				<< " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,		  GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,	  GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,	 GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE", "GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of default framebuffer." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}